

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  string *psVar1;
  long in_FS_OFFSET;
  char *extension_local;
  FilePath *base_name_local;
  FilePath *directory_local;
  int local_134;
  undefined1 local_130 [4];
  int number_local;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  string file;
  
  file.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  local_134 = number;
  std::__cxx11::string::string((string *)local_30);
  if (local_134 == 0) {
    psVar1 = string_abi_cxx11_(base_name);
    std::operator+(&local_70,psVar1,".");
    std::operator+(&local_50,&local_70,extension);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    psVar1 = string_abi_cxx11_(base_name);
    std::operator+(&local_f0,psVar1,"_");
    StreamableToString<int>(&local_110,&local_134);
    std::operator+(&local_d0,&local_f0,&local_110);
    std::operator+(&local_b0,&local_d0,".");
    std::operator+(&local_90,&local_b0,extension);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  FilePath((FilePath *)local_130,(string *)local_30);
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)local_130);
  ~FilePath((FilePath *)local_130);
  std::__cxx11::string::~string((string *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == file.field_2._8_8_) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name,
                                int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file = base_name.string() + "_" + StreamableToString(number)
        + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}